

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  this->success_ = other->success_;
  pbVar1 = (other->message_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
    _Var2._M_p = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pbVar3,_Var2._M_p,_Var2._M_p + pbVar1->_M_string_length);
  }
  (this->message_)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = pbVar3;
  return;
}

Assistant:

AssertionResult::AssertionResult(const AssertionResult& other)
    : success_(other.success_),
      message_(other.message_.get() != nullptr
                   ? new ::std::string(*other.message_)
                   : static_cast< ::std::string*>(nullptr)) {}